

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPlugin.cpp
# Opt level: O1

TestPlugin * __thiscall TestPlugin::removePluginByName(TestPlugin *this,SimpleString *name)

{
  TestPlugin *pTVar1;
  bool bVar2;
  
  if ((this->next_ != (TestPlugin *)0x0) && (bVar2 = operator==(&this->next_->name_,name), bVar2)) {
    pTVar1 = this->next_;
    this->next_ = pTVar1->next_;
    return pTVar1;
  }
  return (TestPlugin *)0x0;
}

Assistant:

TestPlugin* TestPlugin::removePluginByName(const SimpleString& name)
{
    TestPlugin* removed = NULLPTR;
    if (next_ && next_->getName() == name) {
        removed = next_;
        next_ = next_->next_;
    }
    return removed;
}